

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::load(CDT *this,string *filepath)

{
  byte bVar1;
  long local_220;
  ifstream file;
  string *filepath_local;
  CDT *this_local;
  
  std::ifstream::ifstream(&local_220,(string *)filepath,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ifstream::close();
    std::ifstream::~ifstream(&local_220);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [loading model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::load(const std::string& filepath){
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}